

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_range.c
# Opt level: O3

CURLcode Curl_range(Curl_easy *data)

{
  char *str;
  CURLofft CVar1;
  CURLofft CVar2;
  long lVar3;
  long lVar4;
  char *ptr;
  curl_off_t to;
  curl_off_t from;
  char *ptr2;
  byte *local_38;
  long local_30;
  long local_28;
  char *local_20;
  
  lVar4 = 0xf8;
  lVar3 = -1;
  if ((((data->state).field_0x745 & 1) != 0) && (str = (data->state).range, str != (char *)0x0)) {
    CVar1 = curlx_strtoofft(str,(char **)&local_38,10,&local_28);
    if (CVar1 == CURL_OFFT_FLOW) {
      return CURLE_RANGE_ERROR;
    }
    while (((ulong)*local_38 < 0x2e && ((0x200100000200U >> ((ulong)*local_38 & 0x3f) & 1) != 0))) {
      local_38 = local_38 + 1;
    }
    CVar2 = curlx_strtoofft((char *)local_38,&local_20,10,&local_30);
    if (CVar2 == CURL_OFFT_FLOW) {
      return CURLE_RANGE_ERROR;
    }
    if (CVar2 == CURL_OFFT_INVAL && CVar1 == CURL_OFFT_OK) {
      lVar4 = 0x1198;
      lVar3 = local_28;
    }
    else {
      if (CVar1 == CURL_OFFT_INVAL && CVar2 == CURL_OFFT_OK) {
        (data->req).maxdownload = local_30;
        local_28 = -local_30;
      }
      else {
        if (local_30 < local_28) {
          return CURLE_RANGE_ERROR;
        }
        if (local_30 - local_28 == 0x7fffffffffffffff) {
          return CURLE_RANGE_ERROR;
        }
        (data->req).maxdownload = (local_30 - local_28) + 1;
      }
      lVar4 = 0x1198;
      lVar3 = local_28;
    }
  }
  *(long *)((long)&data->magic + lVar4) = lVar3;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_range(struct Curl_easy *data)
{
  curl_off_t from, to;
  char *ptr;
  char *ptr2;

  if(data->state.use_range && data->state.range) {
    CURLofft from_t;
    CURLofft to_t;
    from_t = curlx_strtoofft(data->state.range, &ptr, 10, &from);
    if(from_t == CURL_OFFT_FLOW)
      return CURLE_RANGE_ERROR;
    while(*ptr && (ISBLANK(*ptr) || (*ptr == '-')))
      ptr++;
    to_t = curlx_strtoofft(ptr, &ptr2, 10, &to);
    if(to_t == CURL_OFFT_FLOW)
      return CURLE_RANGE_ERROR;
    if((to_t == CURL_OFFT_INVAL) && !from_t) {
      /* X - */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE %" FMT_OFF_T " to end of file", from));
    }
    else if((from_t == CURL_OFFT_INVAL) && !to_t) {
      /* -Y */
      data->req.maxdownload = to;
      data->state.resume_from = -to;
      DEBUGF(infof(data, "RANGE the last %" FMT_OFF_T " bytes", to));
    }
    else {
      /* X-Y */
      curl_off_t totalsize;

      /* Ensure the range is sensible - to should follow from. */
      if(from > to)
        return CURLE_RANGE_ERROR;

      totalsize = to - from;
      if(totalsize == CURL_OFF_T_MAX)
        return CURLE_RANGE_ERROR;

      data->req.maxdownload = totalsize + 1; /* include last byte */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE from %" FMT_OFF_T
                   " getting %" FMT_OFF_T " bytes",
                   from, data->req.maxdownload));
    }
    DEBUGF(infof(data, "range-download from %" FMT_OFF_T
                 " to %" FMT_OFF_T ", totally %" FMT_OFF_T " bytes",
                 from, to, data->req.maxdownload));
  }
  else
    data->req.maxdownload = -1;
  return CURLE_OK;
}